

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpRenewSubscriptionAsync
              (UpnpClient_Handle Hnd,int TimeOut,char *SubsId,Upnp_FunPtr Fun,void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  undefined4 *__s;
  Handle_Info **HndInfo;
  char *file;
  Handle_Info *SInfo;
  ThreadPoolJob job;
  Handle_Info *local_70;
  ThreadPoolJob local_68;
  
  local_70 = (Handle_Info *)0x0;
  local_68.func = (start_routine)0x0;
  local_68.arg = (void *)0x0;
  local_68.free_func = (free_routine)0x0;
  local_68.requestTime.tv_sec = 0;
  local_68.requestTime.tv_usec = 0;
  local_68.priority = LOW_PRIORITY;
  local_68.jobId = 0;
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x9f3,"Inside UpnpRenewSubscriptionAsync\n");
    HandleReadLock((char *)0x9f5,iVar2);
    HndInfo = &local_70;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    iVar2 = (int)HndInfo;
    if (UVar1 == HND_CLIENT) {
      if (TimeOut < 1 && TimeOut != -1) {
        file = (char *)0x9fe;
      }
      else if (SubsId == (char *)0x0) {
        file = (char *)0xa02;
      }
      else {
        if (Fun != (Upnp_FunPtr)0x0) {
          HandleUnlock((char *)0xa09,iVar2);
          __s = (undefined4 *)malloc(0x760);
          if (__s != (undefined4 *)0x0) {
            memset(__s,0,0x760);
            *__s = 9;
            __s[1] = Hnd;
            strncpy((char *)(__s + 0x1c3),SubsId,0x2b);
            *(Upnp_FunPtr *)(__s + 0x1d0) = Fun;
            *(void **)(__s + 0x1ce) = Cookie_const;
            __s[2] = TimeOut;
            TPJobInit(&local_68,UpnpThreadDistribution,__s);
            TPJobSetFreeFunction(&local_68,free);
            TPJobSetPriority(&local_68,MED_PRIORITY);
            iVar2 = ThreadPoolAdd(&gSendThreadPool,&local_68,(int *)0x0);
            if (iVar2 != 0) {
              free(__s);
            }
            UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa23,
                       "Exiting UpnpRenewSubscriptionAsync\n");
            return 0;
          }
          return -0x68;
        }
        file = (char *)0xa06;
      }
      HandleUnlock(file,iVar2);
      iVar2 = -0x65;
    }
    else {
      HandleUnlock((char *)0x9fa,iVar2);
      iVar2 = -100;
    }
  }
  return iVar2;
}

Assistant:

int UpnpRenewSubscriptionAsync(UpnpClient_Handle Hnd,
	int TimeOut,
	Upnp_SID SubsId,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	ThreadPoolJob job;
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpRenewSubscriptionAsync\n");
	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (TimeOut != UPNP_INFINITE && TimeOut < 1) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (SubsId == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (Fun == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	HandleUnlock(__FILE__, __LINE__);

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));
	if (Param == NULL) {
		return UPNP_E_OUTOF_MEMORY;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = RENEW;
	Param->Handle = Hnd;
	strncpy(Param->SubsId, SubsId, sizeof(Param->SubsId) - 1);
	Param->Fun = Fun;
	Param->Cookie = (void *)Cookie_const;
	Param->TimeOut = TimeOut;

	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free);
	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free(Param);
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpRenewSubscriptionAsync\n");

	return UPNP_E_SUCCESS;
}